

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_streams.cpp
# Opt level: O2

void __thiscall despot::RandomStreams::RandomStreams(RandomStreams *this,int num_streams,int length)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  Random random;
  vector<unsigned_int,_std::allocator<unsigned_int>_> seeds;
  Random local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  *(undefined8 *)
   ((long)&(this->streams_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->streams_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->streams_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->streams_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Seeds::Next((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,num_streams);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->streams_,(long)num_streams);
  uVar3 = 0;
  uVar2 = 0;
  if (0 < length) {
    uVar2 = (ulong)(uint)length;
  }
  uVar4 = (ulong)(uint)num_streams;
  if (num_streams < 1) {
    uVar4 = uVar3;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    Random::Random(&local_4c,local_48._M_impl.super__Vector_impl_data._M_start[uVar3]);
    std::vector<double,_std::allocator<double>_>::resize
              ((this->streams_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar3,(long)length);
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = Random::NextDouble(&local_4c);
      *(double *)
       (*(long *)&(this->streams_).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar5 * 8) = dVar1;
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

RandomStreams::RandomStreams(int num_streams, int length) :
	position_(0) {
	vector<unsigned> seeds = Seeds::Next(num_streams);

	streams_.resize(num_streams);
	for (int i = 0; i < num_streams; i++) {
		Random random(seeds[i]);
		streams_[i].resize(length);
		for (int j = 0; j < length; j++)
			streams_[i][j] = random.NextDouble();
	}
}